

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

char * google::protobuf::ParseLenDelim
                 (int field_number,FieldDescriptor *field,Message *msg,Reflection *reflection,
                 char *ptr,ParseContext *ctx)

{
  MessageFactory *factory;
  Type TVar1;
  int iVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  Message *msg_00;
  string *s;
  char *pcVar4;
  LogMessage *pLVar5;
  LogFinisher local_d5;
  anon_enum_32 utf8_level;
  anon_class_32_4_7f07c394 parse_string;
  char *field_name;
  string local_a8;
  string local_88;
  LogMessage local_68;
  
  TVar1 = FieldDescriptor::type(field);
  if (*(int *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar1 * 4) != 2) {
    pcVar4 = ParsePackedField(field,msg,reflection,ptr,ctx);
    return pcVar4;
  }
  parse_string.utf8_level = &utf8_level;
  utf8_level = kNone;
  parse_string.field_name = &field_name;
  field_name = (char *)0x0;
  parse_string.ptr = ptr;
  parse_string.ctx = ctx;
  TVar1 = FieldDescriptor::type(field);
  if (TVar1 != TYPE_BYTES) {
    if (TVar1 == TYPE_MESSAGE) {
      factory = (ctx->data_).factory;
      if (*(int *)(field + 0x3c) == 3) {
        msg_00 = Reflection::AddMessage(reflection,msg,field,factory);
      }
      else {
        msg_00 = Reflection::MutableMessage(reflection,msg,field,factory);
      }
      pcVar4 = internal::ParseContext::ParseMessage(ctx,msg_00,ptr);
      return pcVar4;
    }
    if (TVar1 != TYPE_STRING) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
                 ,0x16c);
      pLVar5 = internal::LogMessage::operator<<(&local_68,"Wrong type for length delim ");
      TVar1 = FieldDescriptor::type(field);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,TVar1);
      internal::LogFinisher::operator=(&local_d5,pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
      return (char *)0x0;
    }
    utf8_level = (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) + kVerify;
    field_name = (char *)**(undefined8 **)(field + 8);
  }
  if (*(int *)(field + 0x3c) == 3) {
    iVar2 = Reflection::FieldSize(reflection,msg,field);
    std::__cxx11::string::string((string *)&local_88,"",(allocator *)&local_68);
    Reflection::AddString(reflection,msg,field,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    pRVar3 = Reflection::MutableRepeatedPtrField<std::__cxx11::string>(reflection,msg,field);
    s = (string *)((pRVar3->super_RepeatedPtrFieldBase).rep_)->elements[iVar2];
  }
  else {
    std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_68);
    Reflection::SetString(reflection,msg,field,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    s = Reflection::GetStringReference(reflection,msg,field,(string *)0x0);
  }
  pcVar4 = ParseLenDelim::anon_class_32_4_7f07c394::operator()(&parse_string,s);
  return pcVar4;
}

Assistant:

const char* ParseLenDelim(int field_number, const FieldDescriptor* field,
                          Message* msg, const Reflection* reflection,
                          const char* ptr, internal::ParseContext* ctx) {
  if (WireFormat::WireTypeForFieldType(field->type()) !=
      WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    GOOGLE_DCHECK(field->is_packable());
    return ParsePackedField(field, msg, reflection, ptr, ctx);
  }
  enum { kNone = 0, kVerify, kStrict } utf8_level = kNone;
  const char* field_name = nullptr;
  auto parse_string = [ptr, ctx, &utf8_level,
                       &field_name](std::string* s) -> const char* {
    switch (utf8_level) {
      case kNone:
        return internal::InlineGreedyStringParser(s, ptr, ctx);
      case kVerify:
        return internal::InlineGreedyStringParserUTF8Verify(s, ptr, ctx,
                                                            field_name);
      case kStrict:
        return internal::InlineGreedyStringParserUTF8(s, ptr, ctx, field_name);
    }
    GOOGLE_LOG(FATAL) << "Should not reach here";
    return nullptr;  // Make compiler happy
  };
  switch (field->type()) {
    case FieldDescriptor::TYPE_STRING: {
      bool enforce_utf8 = true;
      bool utf8_verification = true;
      if (enforce_utf8 &&
          field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
        utf8_level = kStrict;
      } else if (utf8_verification) {
        utf8_level = kVerify;
      }
      field_name = field->full_name().c_str();
      PROTOBUF_FALLTHROUGH_INTENDED;
    }
    case FieldDescriptor::TYPE_BYTES: {
      if (field->is_repeated()) {
        int index = reflection->FieldSize(*msg, field);
        // Add new empty value.
        reflection->AddString(msg, field, "");
        if (field->options().ctype() == FieldOptions::STRING ||
            field->is_extension()) {
          auto object =
              reflection->MutableRepeatedPtrField<std::string>(msg, field)
                  ->Mutable(index);
          return parse_string(object);
        } else {
          auto object =
              reflection->MutableRepeatedPtrField<std::string>(msg, field)
                  ->Mutable(index);
          return parse_string(object);
        }
      } else {
        // Clear value and make sure it's set.
        reflection->SetString(msg, field, "");
        if (field->options().ctype() == FieldOptions::STRING ||
            field->is_extension()) {
          // HACK around inability to get mutable_string in reflection
          std::string* object = &const_cast<std::string&>(
              reflection->GetStringReference(*msg, field, nullptr));
          return parse_string(object);
        } else {
          // HACK around inability to get mutable_string in reflection
          std::string* object = &const_cast<std::string&>(
              reflection->GetStringReference(*msg, field, nullptr));
          return parse_string(object);
        }
      }
      GOOGLE_LOG(FATAL) << "No other type than string supported";
    }
    case FieldDescriptor::TYPE_MESSAGE: {
      Message* object;
      if (field->is_repeated()) {
        object = reflection->AddMessage(msg, field, ctx->data().factory);
      } else {
        object = reflection->MutableMessage(msg, field, ctx->data().factory);
      }
      return ctx->ParseMessage(object, ptr);
    }
    default:
      GOOGLE_LOG(FATAL) << "Wrong type for length delim " << field->type();
  }
  return nullptr;  // Make compiler happy.
}